

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  psVar3 = getTildes_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2,"\n");
  (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x17);
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                           (string *)
                           (this->super_StreamingReporterBase).currentTestRunInfo.
                           super_Option<Catch::TestRunInfo>.nullableValue);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," b");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &DAT_0015a3c8,"master");
  if (bVar1) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream," (");
    poVar2 = std::operator<<(poVar2,(string *)&DAT_0015a3c8);
    std::operator<<(poVar2,")");
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour((Colour *)poVar2);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getTildes() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != "master" )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            currentTestRunInfo.used = true;
        }